

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collect.h
# Opt level: O0

void __thiscall
server::collectservmode::leavegame(collectservmode *this,clientinfo *ci,bool disconnecting)

{
  int iVar1;
  ENetPacket *packet;
  int local_c4;
  token local_b8;
  token *local_98;
  token *t_1;
  undefined1 local_60 [8];
  packetbuf p;
  token *t;
  int local_28;
  int i;
  int totalenemy;
  int totalfriendly;
  int team;
  bool disconnecting_local;
  clientinfo *ci_local;
  collectservmode *this_local;
  
  (ci->state).tokens = 0;
  if (disconnecting) {
    iVar1 = strcmp(ci->team,"good");
    if (iVar1 == 0) {
      local_c4 = 1;
    }
    else {
      iVar1 = strcmp(ci->team,"evil");
      local_c4 = 0;
      if (iVar1 == 0) {
        local_c4 = 2;
      }
    }
    i = 0;
    local_28 = 0;
    t._4_4_ = vector<server::collectservmode::token>::length(&this->tokens);
LAB_00172ad6:
    t._4_4_ = t._4_4_ + -1;
    if (-1 < t._4_4_) {
      p._32_8_ = vector<server::collectservmode::token>::operator[](&this->tokens,t._4_4_);
      if (((token *)p._32_8_)->dropper != ci->clientnum) goto LAB_00172b14;
      ((token *)p._32_8_)->dropper = -0x80000000;
      goto LAB_00172b28;
    }
  }
  return;
LAB_00172b14:
  if (((token *)p._32_8_)->dropper < -0x7fffffff) {
LAB_00172b28:
    if (((token *)p._32_8_)->team == local_c4) {
      i = i + 1;
      iVar1 = i;
    }
    else {
      local_28 = local_28 + 1;
      iVar1 = local_28;
    }
    if (0xf < iVar1) {
      packetbuf::packetbuf((packetbuf *)local_60,300,1);
      putint((packetbuf *)local_60,0x6d);
      putint((packetbuf *)local_60,*(int *)p._32_8_);
      vector<server::collectservmode::token>::removeunordered
                ((token *)((long)&t_1 + 4),&this->tokens,t._4_4_);
LAB_00172bb5:
      t._4_4_ = t._4_4_ + -1;
      if (-1 < t._4_4_) {
        local_98 = vector<server::collectservmode::token>::operator[](&this->tokens,t._4_4_);
        if (local_98->dropper != ci->clientnum) goto LAB_00172c2e;
        local_98->dropper = -0x80000000;
        goto LAB_00172c45;
      }
      putint((packetbuf *)local_60,-1);
      packet = packetbuf::finalize((packetbuf *)local_60);
      sendpacket(-1,1,packet,-1);
      packetbuf::~packetbuf((packetbuf *)local_60);
    }
  }
  goto LAB_00172ad6;
LAB_00172c2e:
  if (local_98->dropper < -0x7fffffff) {
LAB_00172c45:
    if (local_98->team == local_c4) {
      i = i + 1;
      iVar1 = i;
    }
    else {
      local_28 = local_28 + 1;
      iVar1 = local_28;
    }
    if (0xf < iVar1) {
      putint((packetbuf *)local_60,local_98->id);
      vector<server::collectservmode::token>::removeunordered(&local_b8,&this->tokens,t._4_4_);
    }
  }
  goto LAB_00172bb5;
}

Assistant:

void leavegame(clientinfo *ci, bool disconnecting = false)
    {
        ci->state.tokens = 0;
        if(disconnecting)
        {
            int team = collectteambase(ci->team), totalfriendly = 0, totalenemy = 0;
            loopvrev(tokens)
            {
                token &t = tokens[i];
                if(t.dropper == ci->clientnum) t.dropper = INT_MIN; else if(t.dropper > INT_MIN) continue;
                if(t.team == team ? ++totalfriendly > UNOWNEDTOKENLIMIT : ++totalenemy > UNOWNEDTOKENLIMIT)
                {
                    packetbuf p(300, ENET_PACKET_FLAG_RELIABLE);
                    putint(p, N_EXPIRETOKENS);
                    putint(p, t.id);
                    tokens.removeunordered(i);
                    while(--i >= 0)
                    {
                        token &t = tokens[i];
                        if(t.dropper == ci->clientnum) t.dropper = INT_MIN; else if(t.dropper > INT_MIN) continue;
                        if(t.team == team ? ++totalfriendly > UNOWNEDTOKENLIMIT : ++totalenemy > UNOWNEDTOKENLIMIT)
                        {
                            putint(p, t.id);
                            tokens.removeunordered(i);
                        }
                    }
                    putint(p, -1);
                    sendpacket(-1, 1, p.finalize());
                }
            }
        }
    }